

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageFilledArc(gdImagePtr im,int cx,int cy,int w,int h,int s,int e,int color,int style)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int x2;
  uint uVar5;
  int y2;
  int y1;
  int y2_00;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int x1;
  int x2_00;
  bool bVar11;
  gdPoint pts [363];
  gdPoint local_b88;
  int local_b80 [724];
  
  x2_00 = 0;
  uVar5 = 0x168;
  uVar9 = 0;
  if (s % 0x168 != e % 0x168) {
    uVar1 = e % 0x168;
    if (e < 0x169) {
      uVar1 = e;
    }
    uVar7 = s % 0x168;
    if (s < 0x169) {
      uVar7 = s;
    }
    uVar5 = 0;
    if (0 < (int)uVar7) {
      uVar5 = uVar7;
    }
    uVar7 = (((uVar5 - uVar7) + ((int)uVar7 >> 0x1f)) / 0x168 - ((int)uVar7 >> 0x1f)) * 0x168 +
            uVar7;
    uVar5 = uVar7;
    if ((int)uVar7 < (int)uVar1) {
      uVar5 = uVar1;
    }
    uVar1 = (((uVar5 - uVar1) - (uint)((int)uVar1 < (int)uVar7)) / 0x168 +
            (uint)((int)uVar1 < (int)uVar7)) * 0x168 + uVar1;
    uVar5 = 0x168;
    if (uVar7 != uVar1) {
      uVar5 = uVar1;
    }
    uVar9 = (ulong)uVar7;
    if (uVar7 == uVar1) {
      uVar9 = 0;
    }
  }
  iVar10 = 1;
  y2_00 = 0;
  x2 = 0;
  y2 = 0;
  iVar8 = (int)uVar9;
  if (iVar8 <= (int)uVar5) {
    uVar1 = iVar8 - 0x10f;
    iVar4 = 0;
    y2 = 0;
    x2 = 0;
    x1 = 0;
    y1 = 0;
    do {
      uVar3 = (ulong)(uint)(((int)uVar9 + (int)(uVar9 / 0x168) * -0x168) * 4);
      uVar2 = (long)*(int *)((long)gdCosT + uVar3) * (long)w;
      uVar6 = uVar2 + 0x7ff;
      if (-1 < (long)uVar2) {
        uVar6 = uVar2;
      }
      x2_00 = (int)(uVar6 >> 0xb) + cx;
      uVar2 = (long)*(int *)((long)gdSinT + uVar3) * (long)h;
      uVar6 = uVar2 + 0x7ff;
      if (-1 < (long)uVar2) {
        uVar6 = uVar2;
      }
      y2_00 = (int)(uVar6 >> 0xb) + cy;
      bVar11 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar11) {
        x2 = x2_00;
        y2 = y2_00;
        if ((style & 3U) == 0) {
          (&local_b88)[iVar10].x = x2_00;
          local_b80[(long)iVar10 * 2 + -1] = y2_00;
          local_b88.x = cx;
          local_b88.y = cy;
        }
      }
      else if ((style & 1U) == 0) {
        if ((style & 2U) == 0) {
          if (y2_00 == y1) {
            iVar10 = iVar10 + -1;
            if (((uVar1 < 0xffffff4b) && (x1 < x2_00)) || ((uVar1 + 0xb4 < 0xb3 && (x2_00 < x1)))) {
              (&local_b88)[iVar10].x = x2_00;
            }
          }
          else {
            (&local_b88)[iVar10].x = x2_00;
            local_b80[(long)iVar10 * 2 + -1] = y2_00;
          }
        }
        else {
          gdImageLine(im,x1,y1,x2_00,y2_00,color);
        }
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      iVar10 = iVar10 + 1;
      uVar1 = uVar1 + 1;
      x1 = x2_00;
      y1 = y2_00;
    } while (~uVar5 + iVar8 != iVar4);
  }
  if ((style & 1U) == 0) {
    if ((style & 2U) != 0) {
      if ((style & 4U) == 0) {
        return;
      }
      gdImageLine(im,cx,cy,x2_00,y2_00,color);
      x2_00 = x2;
      iVar10 = cy;
      x2 = cx;
      y2_00 = y2;
LAB_0010de0b:
      gdImageLine(im,x2,iVar10,x2_00,y2_00,color);
      return;
    }
    (&local_b88)[iVar10].x = cx;
    local_b80[(long)iVar10 * 2 + -1] = cy;
    iVar10 = iVar10 + 1;
  }
  else {
    if ((style & 2U) != 0) {
      iVar10 = y2;
      if ((style & 4U) != 0) {
        gdImageLine(im,cx,cy,x2_00,y2_00,color);
        gdImageLine(im,cx,cy,x2,y2,color);
      }
      goto LAB_0010de0b;
    }
    iVar10 = 3;
    local_b88.x = x2;
    local_b88.y = y2;
    local_b80[0] = x2_00;
    local_b80[1] = y2_00;
    local_b80[2] = cx;
    local_b80[3] = cy;
  }
  gdImageFilledPolygon(im,&local_b88,iVar10,color);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledArc (gdImagePtr im, int cx, int cy, int w, int h, int s, int e,
									int color, int style)
{
	gdPoint pts[363];
	int i, pti;
	int lx = 0, ly = 0;
	int fx = 0, fy = 0;

	if ((s % 360)  == (e % 360)) {
		s = 0;
		e = 360;
	} else {
		if (s > 360) {
			s = s % 360;
		}

		if (e > 360) {
			e = e % 360;
		}

		while (s < 0) {
			s += 360;
		}

		while (e < s) {
			e += 360;
		}

		if (s == e) {
			s = 0;
			e = 360;
		}
	}

	for (i = s, pti = 1; (i <= e); i++, pti++) {
		int x, y;
		x = ((long) gdCosT[i % 360] * (long) w / (2 * 1024)) + cx;
		y = ((long) gdSinT[i % 360] * (long) h / (2 * 1024)) + cy;
		if (i != s) {
			if (!(style & gdChord)) {
				if (style & gdNoFill) {
					gdImageLine (im, lx, ly, x, y, color);
				} else {
					if (y == ly) {
						pti--; /* don't add this point */
						if (((i > 270 || i < 90) && x > lx) || ((i >  90 && i < 270) && x < lx)) {
							/* replace the old x coord, if increasing on the
							   right side or decreasing on the left side */
							pts[pti].x = x;
						}
					} else {
						pts[pti].x = x;
						pts[pti].y = y;
					}
				}
			}
		} else {
			fx = x;
			fy = y;

			if (!(style & (gdChord | gdNoFill))) {
				pts[0].x = cx;
				pts[0].y = cy;
				pts[pti].x = x;
				pts[pti].y = y;
			}
		}
		lx = x;
		ly = y;
	}
	if (style & gdChord) {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
			gdImageLine (im, fx, fy, lx, ly, color);
		} else {
			pts[0].x = fx;
			pts[0].y = fy;
			pts[1].x = lx;
			pts[1].y = ly;
			pts[2].x = cx;
			pts[2].y = cy;
			gdImageFilledPolygon (im, pts, 3, color);
		}
	} else {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
		} else {
			pts[pti].x = cx;
			pts[pti].y = cy;
			gdImageFilledPolygon(im, pts, pti+1, color);
		}
	}
}